

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int l_strton(TValue *obj,TValue *result)

{
  lua_CFunction p_Var1;
  char *pcVar2;
  code *local_40;
  char *s;
  size_t stlen;
  TString *st;
  TValue *result_local;
  TValue *obj_local;
  
  if ((obj->tt_ & 0xf) == 4) {
    p_Var1 = (obj->value_).f;
    if ((char)p_Var1[0xb] < '\0') {
      s = *(char **)(p_Var1 + 0x10);
      local_40 = *(code **)(p_Var1 + 0x18);
    }
    else {
      s = (char *)(long)(char)p_Var1[0xb];
      local_40 = p_Var1 + 0x18;
    }
    pcVar2 = (char *)luaO_str2num((char *)local_40,result);
    obj_local._4_4_ = (uint)(pcVar2 == s + 1);
  }
  else {
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

static int l_strton (const TValue *obj, TValue *result) {
  lua_assert(obj != result);
  if (!cvt2num(obj))  /* is object not a string? */
    return 0;
  else {
    TString *st = tsvalue(obj);
    size_t stlen;
    const char *s = getlstr(st, stlen);
    return (luaO_str2num(s, result) == stlen + 1);
  }
}